

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_exception_what_method
          (t_cpp_generator *this,ostream *out,t_struct *tstruct)

{
  t_struct *ptVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_40;
  t_struct *local_20;
  t_struct *tstruct_local;
  ostream *out_local;
  t_cpp_generator *this_local;
  
  local_20 = tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  t_generator::indent_abi_cxx11_(&local_40,(t_generator *)this);
  std::operator<<(out,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  generate_exception_what_method_decl(this,(ostream *)tstruct_local,local_20,true);
  poVar3 = std::operator<<((ostream *)tstruct_local," {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_70);
  poVar3 = std::operator<<(poVar3,"try {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_70);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_90);
  poVar3 = std::operator<<(poVar3,"std::stringstream ss;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_b0);
  poVar3 = std::operator<<(poVar3,"ss << \"TException - service has thrown: \" << *this;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_b0);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_d0);
  poVar3 = std::operator<<(poVar3,"this->thriftTExceptionMessageHolder_ = ss.str();");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_d0);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_f0);
  poVar3 = std::operator<<(poVar3,"return this->thriftTExceptionMessageHolder_.c_str();");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_f0);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_110);
  poVar3 = std::operator<<(poVar3,"} catch (const std::exception&) {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_110);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_130);
  poVar3 = std::operator<<(poVar3,"return \"TException - service has thrown: ");
  iVar2 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
  poVar3 = std::operator<<(poVar3,"\";");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_130);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_150);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_150);
  t_generator::indent_down((t_generator *)this);
  poVar3 = std::operator<<((ostream *)tstruct_local,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_cpp_generator::generate_exception_what_method(std::ostream& out, t_struct* tstruct) {
  out << indent();
  generate_exception_what_method_decl(out, tstruct, true);
  out << " {" << endl;

  indent_up();
  out << indent() << "try {" << endl;

  indent_up();
  out << indent() << "std::stringstream ss;" << endl;
  out << indent() << "ss << \"TException - service has thrown: \" << *this;" << endl;
  out << indent() << "this->thriftTExceptionMessageHolder_ = ss.str();" << endl;
  out << indent() << "return this->thriftTExceptionMessageHolder_.c_str();" << endl;
  indent_down();

  out << indent() << "} catch (const std::exception&) {" << endl;

  indent_up();
  out << indent() << "return \"TException - service has thrown: " << tstruct->get_name() << "\";"
      << endl;
  indent_down();

  out << indent() << "}" << endl;

  indent_down();
  out << "}" << endl << endl;
}